

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint8_t mipsdsp_sat8_reduce_precision(uint16_t a,CPUMIPSState_conflict5 *env)

{
  uint32_t sign;
  uint16_t mag;
  CPUMIPSState_conflict5 *env_local;
  uint16_t a_local;
  
  if ((int)(uint)a >> 0xf == 0) {
    if ((a & 0x7fff) < 0x7f81) {
      env_local._7_1_ = (uint8_t)((int)(uint)(a & 0x7fff) >> 7);
    }
    else {
      set_DSPControl_overflow_flag(1,0x16,env);
      env_local._7_1_ = 0xff;
    }
  }
  else {
    set_DSPControl_overflow_flag(1,0x16,env);
    env_local._7_1_ = '\0';
  }
  return env_local._7_1_;
}

Assistant:

static inline uint8_t mipsdsp_sat8_reduce_precision(uint16_t a,
                                                    CPUMIPSState *env)
{
    uint16_t mag;
    uint32_t sign;

    sign = (a >> 15) & 0x01;
    mag = a & 0x7FFF;

    if (sign == 0) {
        if (mag > 0x7F80) {
            set_DSPControl_overflow_flag(1, 22, env);
            return 0xFF;
        } else {
            return (mag >> 7) & 0xFFFF;
        }
    } else {
        set_DSPControl_overflow_flag(1, 22, env);
        return 0x00;
    }
}